

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 soft_f64_muladd(float64 a,float64 b,float64 c,int flags,float_status *status)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  float64 fVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  int count;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  uint uVar18;
  FloatParts FVar19;
  FloatParts FVar20;
  FloatParts FVar21;
  FloatParts a_00;
  FloatParts b_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_68;
  uint64_t local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t c_lo;
  uint64_t c_hi;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar19 = float64_unpack_raw(a);
  FVar19 = sf_canonicalize(FVar19,&float64_params,status);
  uVar8 = FVar19._8_8_;
  local_60 = FVar19.frac;
  FVar20 = float64_unpack_raw(b);
  FVar20 = sf_canonicalize(FVar20,&float64_params,status);
  FVar21 = float64_unpack_raw(c);
  FVar21 = sf_canonicalize(FVar21,&float64_params,status);
  uVar12 = FVar21.frac;
  if (((((undefined1  [16])FVar19 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar20 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar21 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar12 = FVar20._8_8_ & 0xffffffffffff;
    a_00.exp = (int)uVar8;
    a_00.cls = (char)(uVar8 >> 0x20);
    a_00.sign = (_Bool)(char)(uVar8 >> 0x28);
    a_00._14_2_ = (short)(uVar8 >> 0x30);
    a_00.frac = local_60;
    b_00.exp = (int)uVar12;
    b_00.cls = (char)(uVar12 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar12 >> 0x28);
    b_00._14_2_ = (short)(uVar12 >> 0x30);
    b_00.frac = FVar20.frac;
    FVar19 = pick_nan_muladd(a_00,b_00,FVar21,SUB81(status,0),
                             (float_status *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    goto LAB_00b15fff;
  }
  uVar7 = FVar20._12_4_ & 0xff;
  uVar4 = FVar19._12_4_ & 0xff;
  if ((1 << (FVar20.cls & 0x1f) | 1 << (FVar19._12_4_ & 0x1f)) != 10) {
    uVar13 = (uint)local_50 & 4;
    uVar11 = 0x10000000000;
    uVar16 = FVar21._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar16 = FVar21._8_8_;
    }
    uVar9 = (FVar20._8_8_ ^ uVar8) & 0x10000000000;
    uVar15 = (ulong)(uVar9 == 0);
    if ((local_50 & 2) == 0) {
      uVar15 = uVar9 >> 0x28;
    }
    uVar3 = (uint)(uVar16 >> 0x20);
    uVar14 = (uint)uVar15;
    if ((uVar4 != 3) && (uVar7 != 3)) {
      uVar18 = uVar3 & 3;
      if (uVar18 == 3) {
        uVar4 = uVar3 >> 8 & 1;
LAB_00b15fba:
        if (uVar4 == uVar13 >> 2) {
          uVar11 = 0;
        }
        goto LAB_00b15ff4;
      }
      if ((uVar4 == 1) || (uVar7 == 1)) {
        if (uVar18 == 1) {
          if ((uVar3 >> 8 & 1) != uVar14) {
            uVar15 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar16 = uVar16 & 0xffff0003ffffffff | uVar15 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar16 = uVar16 & 0xffffff0300000000 | (ulong)((int)uVar16 - 1);
        }
        if (((uint)(uVar16 >> 0x28) & 1) == uVar13 >> 2) {
          uVar11 = 0;
        }
        uVar11 = uVar11 | uVar16 & 0xffff00ffffffffff;
        FVar19.exp = (int)uVar11;
        FVar19.cls = (char)(uVar11 >> 0x20);
        FVar19.sign = (_Bool)(char)(uVar11 >> 0x28);
        FVar19._14_2_ = (short)(uVar11 >> 0x30);
        FVar19.frac = uVar12;
        goto LAB_00b15fff;
      }
      local_58 = uVar16;
      if ((uVar4 != 2) || (uVar7 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      iVar10 = FVar20.exp + FVar19.exp;
      mul64To128(local_60,FVar20.frac,&local_48,&local_68);
      if ((local_48 >> 0x3d & 1) != 0) {
        local_68 = (ulong)((uint)local_68 & 1) | local_48 << 0x3f | local_68 >> 1;
        local_48 = local_48 >> 1;
        iVar10 = iVar10 + 1;
      }
      uVar11 = local_48;
      if (uVar18 == 1) {
        uVar17 = (ulong)((local_68 & 0x3fffffffffffffff) != 0) | local_48 << 2 | local_68 >> 0x3e;
      }
      else {
        count = iVar10 - (int)local_58;
        if (((uint)(local_58 >> 0x28) & 1) == (uVar14 & 0xff)) {
          if (count < 1) {
            shift128RightJamming(local_48,local_68,0x3e - count,&local_48,&local_68);
            iVar10 = (int)local_58;
            uVar17 = uVar12 + local_68;
          }
          else {
            c_hi = uVar12 >> 2;
            local_60 = CONCAT44(local_60._4_4_,iVar10);
            c_lo = 0;
            shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
            uVar17 = (ulong)((c_lo + local_68 & 0x3fffffffffffffff) != 0) |
                     (uVar11 + c_hi + (ulong)CARRY8(c_lo,local_68)) * 4 | c_lo + local_68 >> 0x3e;
            iVar10 = (int)local_60;
          }
          if ((long)uVar17 < 0) {
            uVar17 = (ulong)((uint)uVar17 & 1) | uVar17 >> 1;
            iVar10 = iVar10 + 1;
          }
        }
        else {
          uVar12 = uVar12 >> 2;
          c_lo = 0;
          c_hi = uVar12;
          if (count < 1) {
            shift128RightJamming(local_48,local_68,-count,&local_48,&local_68);
            if ((iVar10 != (int)local_58) ||
               (uVar16 = local_48 - uVar12, uVar11 = local_68, local_48 < uVar12)) {
              uVar16 = (uVar12 - local_48) - (ulong)(local_68 != 0);
              uVar14 = (uint)(byte)((byte)uVar14 ^ 1);
              uVar11 = -local_68;
              iVar10 = (int)local_58;
            }
          }
          else {
            shift128RightJamming(uVar12,0,count,&c_hi,&c_lo);
            uVar16 = (uVar11 - c_hi) - (ulong)(local_68 < c_lo);
            uVar11 = local_68 - c_lo;
          }
          if (uVar16 == 0 && uVar11 == 0) {
            uVar12 = 0x10000000000;
            if (uVar13 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
              uVar12 = 0;
            }
            uVar11 = (uVar12 | uVar8 & 0xffff0000ffffffff) + 0x100000000;
            goto LAB_00b15ffa;
          }
          if (uVar16 == 0) {
            if (uVar11 == 0) {
              uVar12 = 0x40;
            }
            else {
              uVar12 = 0x3f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar12 = uVar12 ^ 0x3f;
            }
            if (uVar12 == 0) {
              uVar4 = 0x40;
              goto LAB_00b162f9;
            }
            uVar4 = (int)uVar12 + 0x40;
            uVar17 = uVar11 << ((char)uVar12 - 1U & 0x3f);
          }
          else {
            lVar1 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar4 = (uint)lVar1 ^ 0x3f;
LAB_00b162f9:
            bVar6 = (char)uVar4 - 1;
            bVar2 = bVar6 & 0x3f;
            uVar17 = (ulong)(uVar11 << (bVar6 & 0x3f) != 0) |
                     uVar16 << bVar2 | uVar11 >> 0x40 - bVar2;
          }
          iVar10 = (iVar10 - uVar4) + 3;
        }
      }
      uVar12 = 0x10000000000;
      if (uVar13 >> 2 == (uVar14 & 0xff)) {
        uVar12 = 0;
      }
      uVar12 = uVar12 | uVar8 & 0xffff000000000000 |
               (ulong)(uint)((((int)local_50 << 0x1c) >> 0x1f) + iVar10) | 0x200000000;
      FVar19.exp = (int)uVar12;
      FVar19.cls = (char)(uVar12 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar12 >> 0x28);
      FVar19._14_2_ = (short)(uVar12 >> 0x30);
      FVar19.frac = uVar17;
      goto LAB_00b15fff;
    }
    if ((~uVar16 & 0x300000000) != 0) {
      if (uVar13 >> 2 == uVar14) {
        uVar11 = 0;
      }
LAB_00b15ff4:
      uVar11 = uVar11 | uVar8 & 0xffff0000ffffffff | 0x300000000;
LAB_00b15ffa:
      FVar19.exp = (int)uVar11;
      FVar19.cls = (char)(uVar11 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar11 >> 0x28);
      FVar19._14_2_ = (short)(uVar11 >> 0x30);
      FVar19.frac = local_60;
      goto LAB_00b15fff;
    }
    uVar4 = uVar3 >> 8 & 1;
    if (uVar4 == uVar14) goto LAB_00b15fba;
  }
  FVar19.exp = 0x7fffffff;
  FVar19.cls = float_class_qnan;
  FVar19.sign = false;
  FVar19._14_2_ = 0;
  FVar19.frac = 0x2000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00b15fff:
  FVar19 = round_canonical(FVar19,status,&float64_params);
  fVar5 = float64_pack_raw(FVar19);
  return fVar5;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_muladd(float64 a, float64 b, float64 c, int flags,
                float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pc = float64_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float64_round_pack_canonical(pr, status);
}